

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv_free_cpu_info(uv_cpu_info_t *cpu_infos,int count)

{
  int local_18;
  int i;
  int count_local;
  uv_cpu_info_t *cpu_infos_local;
  
  for (local_18 = 0; local_18 < count; local_18 = local_18 + 1) {
    uv__free(cpu_infos[local_18].model);
  }
  uv__free(cpu_infos);
  return;
}

Assistant:

void uv_free_cpu_info(uv_cpu_info_t* cpu_infos, int count) {
  int i;

  for (i = 0; i < count; i++)
    uv__free(cpu_infos[i].model);

  uv__free(cpu_infos);
}